

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O3

void flatbuffers::AppendShortOption(stringstream *ss,FlatCOption *option)

{
  ostream *poVar1;
  
  if ((option->short_opt)._M_string_length != 0) {
    poVar1 = (ostream *)(ss + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(option->short_opt)._M_dataplus._M_p,(option->short_opt)._M_string_length);
    if ((option->long_opt)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"|",1);
    }
  }
  if ((option->long_opt)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),"--",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(ss + 0x10),(option->long_opt)._M_dataplus._M_p,
               (option->long_opt)._M_string_length);
    return;
  }
  return;
}

Assistant:

static void AppendShortOption(std::stringstream &ss,
                              const FlatCOption &option) {
  if (!option.short_opt.empty()) {
    ss << "-" << option.short_opt;
    if (!option.long_opt.empty()) { ss << "|"; }
  }
  if (!option.long_opt.empty()) { ss << "--" << option.long_opt; }
}